

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

nng_err nni_http_init(nng_http **connp,nng_stream *stream,_Bool client)

{
  int iVar1;
  nni_http_conn *conn;
  uint8_t *puVar2;
  char *__s2;
  long lVar3;
  
  conn = (nni_http_conn *)nni_zalloc(0x8e8);
  if (conn != (nni_http_conn *)0x0) {
    conn->client = client;
    nni_mtx_init(&conn->mtx);
    nni_aio_list_init(&conn->rdq);
    nni_aio_list_init(&conn->wrq);
    nni_http_req_init(&conn->req);
    nni_http_res_init(&conn->res);
    lVar3 = 1;
    __s2 = "HTTP/1.1";
    do {
      iVar1 = strcmp("HTTP/1.1",__s2);
      if (iVar1 == 0) {
        conn->vers = __s2;
        break;
      }
      __s2 = nni_http_set_version::http_versions[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    builtin_strncpy(conn->meth,"GET",4);
    puVar2 = (uint8_t *)nni_alloc(0x1fe0);
    conn->buf = puVar2;
    if (puVar2 != (uint8_t *)0x0) {
      conn->bufsz = 0x1fe0;
      nni_aio_init(&conn->wr_aio,http_wr_cb,conn);
      nni_aio_init(&conn->rd_aio,http_rd_cb,conn);
      conn->sock = stream;
      *connp = conn;
      return NNG_OK;
    }
    nni_http_conn_fini(conn);
  }
  nng_stream_free(stream);
  return NNG_ENOMEM;
}

Assistant:

static nng_err
http_init(nni_http_conn **connp, nng_stream *data, bool client)
{
	nni_http_conn *conn;

	if ((conn = NNI_ALLOC_STRUCT(conn)) == NULL) {
		return (NNG_ENOMEM);
	}
	conn->client = client;
	nni_mtx_init(&conn->mtx);
	nni_aio_list_init(&conn->rdq);
	nni_aio_list_init(&conn->wrq);
	nni_http_req_init(&conn->req);
	nni_http_res_init(&conn->res);
	nni_http_set_version(conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_method(conn, "GET");

	if ((conn->buf = nni_alloc(HTTP_BUFSIZE)) == NULL) {
		nni_http_conn_fini(conn);
		return (NNG_ENOMEM);
	}
	conn->bufsz = HTTP_BUFSIZE;

	nni_aio_init(&conn->wr_aio, http_wr_cb, conn);
	nni_aio_init(&conn->rd_aio, http_rd_cb, conn);

	conn->sock = data;

	*connp = conn;

	return (NNG_OK);
}